

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,long,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleUpOperator>
               (hugeint_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t extraout_RDX;
  idx_t iVar6;
  idx_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  int64_t iVar7;
  DecimalScaleInput<duckdb::hugeint_t,_long> *data;
  ulong uVar8;
  int64_t *piVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar9 = &ldata->upper;
    iVar6 = count;
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      input.upper = iVar6;
      input.lower = *piVar9;
      lVar3 = Cast::Operation<duckdb::hugeint_t,long>
                        ((Cast *)((hugeint_t *)(piVar9 + -1))->lower,input);
      result_data[iVar10] = lVar3 * *(long *)((long)dataptr + 0x30);
      piVar9 = piVar9 + 2;
      iVar6 = extraout_RDX_00;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      iVar7 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      iVar7 = extraout_RDX_01;
    }
    uVar8 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
LAB_017119ad:
        piVar9 = &ldata[uVar8].upper;
        for (; uVar4 = uVar8, uVar8 < uVar11; uVar8 = uVar8 + 1) {
          input_00.upper = iVar7;
          input_00.lower = *piVar9;
          lVar3 = Cast::Operation<duckdb::hugeint_t,long>
                            ((Cast *)((hugeint_t *)(piVar9 + -1))->lower,input_00);
          result_data[uVar8] = lVar3 * *(long *)((long)dataptr + 0x30);
          piVar9 = piVar9 + 2;
          iVar7 = extraout_RDX_02;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_017119ad;
        uVar4 = uVar11;
        if (uVar2 != 0) {
          piVar9 = &ldata[uVar8].upper;
          for (uVar12 = 0; uVar4 = uVar12 + uVar8, uVar12 + uVar8 < uVar11; uVar12 = uVar12 + 1) {
            if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
              input_01.upper = iVar7;
              input_01.lower = *piVar9;
              lVar3 = Cast::Operation<duckdb::hugeint_t,long>
                                ((Cast *)((hugeint_t *)(piVar9 + -1))->lower,input_01);
              result_data[uVar8 + uVar12] = lVar3 * *(long *)((long)dataptr + 0x30);
              iVar7 = extraout_RDX_03;
            }
            piVar9 = piVar9 + 2;
          }
        }
      }
      uVar8 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}